

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

int Ivy_CutFindOrAddFilter(Ivy_Store_t *pCutStore,Ivy_Cut_t *pCutNew)

{
  int iVar1;
  Ivy_Cut_t *pCut_00;
  int local_30;
  int local_2c;
  int k;
  int i;
  Ivy_Cut_t *pCut;
  Ivy_Cut_t *pCutNew_local;
  Ivy_Store_t *pCutStore_local;
  
  if (pCutNew->uHash == 0) {
    __assert_fail("pCutNew->uHash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                  ,0x36d,"int Ivy_CutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  local_2c = 0;
  do {
    if (pCutStore->nCuts <= local_2c) {
      if (pCutStore->nCuts < pCutStore->nCutsMax) {
        iVar1 = pCutStore->nCuts;
        pCutStore->nCuts = iVar1 + 1;
        memcpy(pCutStore->pCuts + iVar1,pCutNew,0x24);
        return 0;
      }
      __assert_fail("pCutStore->nCuts < pCutStore->nCutsMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                    ,0x396,"int Ivy_CutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
    }
    pCut_00 = pCutStore->pCuts + local_2c;
    if (pCut_00->nSize != 0) {
      if (pCut_00->nSize == pCutNew->nSize) {
        if (pCut_00->uHash == pCutNew->uHash) {
          for (local_30 = 0;
              (local_30 < pCutNew->nSize && (pCut_00->pArray[local_30] == pCutNew->pArray[local_30])
              ); local_30 = local_30 + 1) {
          }
          if (local_30 == pCutNew->nSize) {
            return 1;
          }
        }
      }
      else if (pCut_00->nSize < pCutNew->nSize) {
        if (((pCut_00->uHash & pCutNew->uHash) == pCut_00->uHash) &&
           (iVar1 = Ivy_CutCheckDominance(pCut_00,pCutNew), iVar1 != 0)) {
          return 1;
        }
      }
      else if (((pCut_00->uHash & pCutNew->uHash) == pCutNew->uHash) &&
              (iVar1 = Ivy_CutCheckDominance(pCutNew,pCut_00), iVar1 != 0)) {
        pCut_00->nSize = 0;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Ivy_CutFindOrAddFilter( Ivy_Store_t * pCutStore, Ivy_Cut_t * pCutNew )
{
    Ivy_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uHash );
    // try to find the cut
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        if ( pCut->nSize == pCutNew->nSize )
        {
            if ( pCut->uHash == pCutNew->uHash )
            {
                for ( k = 0; k < pCutNew->nSize; k++ )
                    if ( pCut->pArray[k] != pCutNew->pArray[k] )
                        break;
                if ( k == pCutNew->nSize )
                    return 1;
            }
            continue;
        }
        if ( pCut->nSize < pCutNew->nSize )
        {
            // skip the non-contained cuts
            if ( (pCut->uHash & pCutNew->uHash) != pCut->uHash )
                continue;
            // check containment seriously
            if ( Ivy_CutCheckDominance( pCut, pCutNew ) )
                return 1;
            continue;
        }
        // check potential containment of other cut

        // skip the non-contained cuts
        if ( (pCut->uHash & pCutNew->uHash) != pCutNew->uHash )
            continue;
        // check containment seriously
        if ( Ivy_CutCheckDominance( pCutNew, pCut ) )
        {
            // remove the current cut
            pCut->nSize = 0;
        }
    }
    assert( pCutStore->nCuts < pCutStore->nCutsMax );
    // add the cut
    pCut = pCutStore->pCuts + pCutStore->nCuts++;
    *pCut = *pCutNew;
    return 0;
}